

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O2

vector<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
* processIRTtoASS(vector<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
                  *__return_storage_ptr__,
                 shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
                 *methodToIRTMap,ostream *out)

{
  element_type *peVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  PatternMatcher patternMatcher;
  AssemblyCommands commands;
  PatternMatcher local_60;
  AssemblyCommands local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AssemblyCode::PatternMatcher::PatternMatcher(&local_60);
  peVar1 = (methodToIRTMap->
           super___shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var3 = (peVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(peVar1->_M_t)._M_impl.super__Rb_tree_header) {
    poVar2 = std::operator<<(out,";-----------------------------------");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    std::operator<<(poVar2,"--------------------------------------\n");
    AssemblyCode::PatternMatcher::GenerateCode(&local_48,&local_60,*(CStatementList **)(p_Var3 + 2))
    ;
    WriteAssemblyToFile(&local_48,out);
    std::
    vector<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>,_std::allocator<std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>_>
    ::push_back(__return_storage_ptr__,&local_48);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::~vector(&local_48);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    peVar1 = (methodToIRTMap->
             super___shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  }
  std::
  vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>::
  ~vector(&local_60.patterns);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AssemblyCommands> processIRTtoASS(std::shared_ptr<const MethodToIRTMap> methodToIRTMap, std::ostream &out) {
    std::vector<AssemblyCommands> commandsBatch;
    AssemblyCode::PatternMatcher patternMatcher;
    for ( auto it = methodToIRTMap->begin(); it != methodToIRTMap->end(); ++it) {
        out << ";-----------------------------------" << it->first << "--------------------------------------\n";
        AssemblyCommands commands = patternMatcher.GenerateCode( static_cast<const IRT::CStatementList *>(it->second.get()));
        WriteAssemblyToFile(commands, out);
        commandsBatch.push_back(commands);
    }

    return commandsBatch;
}